

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

Object<(anonymous_namespace)::Version> * __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::
Bind<(anonymous_namespace)::Version,int,std::function<cmCTestResourceSpec::ReadFileResult(int&,Json::Value_const*)>>
          (Object<(anonymous_namespace)::Version> *this,string_view *name,
          offset_in_Version_to_int member,
          function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *func,
          bool required)

{
  pointer *ppMVar1;
  undefined8 *puVar2;
  pointer pMVar3;
  _Manager_type p_Var4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  pointer pMVar8;
  pointer pMVar9;
  ulong uVar10;
  _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
  *this_00;
  long lVar11;
  pointer pMVar12;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  pointer local_98;
  _Any_data local_90;
  code *local_80;
  undefined8 uStack_78;
  offset_in_Version_to_int local_70;
  size_t local_68;
  char *pcStack_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  undefined1 local_38;
  
  std::function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)>::function
            ((function<cmCTestResourceSpec::ReadFileResult_(int_&,_const_Json::Value_*)> *)&local_90
             ,func);
  local_b8 = (undefined8 *)0x0;
  uStack_b0 = 0;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  local_70 = member;
  local_b8 = (undefined8 *)operator_new(0x28);
  *local_b8 = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = uStack_78;
  if (local_80 != (code *)0x0) {
    *local_b8 = local_90._M_unused._M_object;
    local_b8[1] = local_90._8_8_;
    local_b8[2] = local_80;
    local_80 = (code *)0x0;
    uStack_78 = 0;
  }
  local_b8[4] = member;
  local_68 = name->_M_len;
  pcStack_60 = name->_M_str;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  uStack_50 = uStack_b0;
  local_48 = std::
             _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
             ::_M_manager;
  pcStack_40 = std::
               _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
               ::_M_invoke;
  pMVar3 = (this->Members).
           super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = 1;
  local_58 = local_b8;
  if (pMVar3 == (this->Members).
                super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_98 = (this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)pMVar3 - (long)local_98;
    if (lVar11 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (lVar11 >> 3) * 0x6db6db6db6db6db7;
    uVar7 = 1;
    if (pMVar3 != local_98) {
      uVar7 = uVar10;
    }
    this_00 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               *)(uVar7 + uVar10);
    if ((_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
         *)0x249249249249248 < this_00) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                 *)0x249249249249249;
    }
    if (CARRY8(uVar7,uVar10)) {
      this_00 = (_Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                 *)0x249249249249249;
    }
    pMVar8 = std::
             _Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
             ::_M_allocate(this_00,(size_t)func);
    *(size_t *)((long)pMVar8 + lVar11) = local_68;
    ((size_t *)((long)pMVar8 + lVar11))[1] = (size_t)pcStack_60;
    puVar2 = (undefined8 *)((long)pMVar8 + lVar11 + 0x10);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined8 *)((long)pMVar8 + lVar11 + 0x20) = 0;
    *(code **)((long)pMVar8 + lVar11 + 0x28) = pcStack_40;
    if (local_48 != (code *)0x0) {
      *(undefined8 **)((long)pMVar8 + lVar11 + 0x10) = local_58;
      *(undefined8 *)((long)pMVar8 + lVar11 + 0x18) = uStack_50;
      *(code **)((long)pMVar8 + lVar11 + 0x20) = local_48;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
    }
    *(undefined1 *)((long)pMVar8 + lVar11 + 0x30) = local_38;
    pMVar12 = pMVar8;
    for (pMVar9 = local_98; pMVar3 != pMVar9; pMVar9 = pMVar9 + 1) {
      pcVar5 = (pMVar9->Name)._M_str;
      (pMVar12->Name)._M_len = (pMVar9->Name)._M_len;
      (pMVar12->Name)._M_str = pcVar5;
      *(undefined8 *)&(pMVar12->Function).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(pMVar12->Function).super__Function_base._M_functor + 8) = 0;
      (pMVar12->Function).super__Function_base._M_manager = (_Manager_type)0x0;
      (pMVar12->Function)._M_invoker = (pMVar9->Function)._M_invoker;
      p_Var4 = (pMVar9->Function).super__Function_base._M_manager;
      if (p_Var4 != (_Manager_type)0x0) {
        uVar6 = *(undefined8 *)((long)&(pMVar9->Function).super__Function_base._M_functor + 8);
        *(undefined8 *)&(pMVar12->Function).super__Function_base._M_functor =
             *(undefined8 *)&(pMVar9->Function).super__Function_base._M_functor;
        *(undefined8 *)((long)&(pMVar12->Function).super__Function_base._M_functor + 8) = uVar6;
        (pMVar12->Function).super__Function_base._M_manager = p_Var4;
        (pMVar9->Function).super__Function_base._M_manager = (_Manager_type)0x0;
        (pMVar9->Function)._M_invoker = (_Invoker_type)0x0;
      }
      pMVar12->Required = pMVar9->Required;
      pMVar12 = pMVar12 + 1;
    }
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98,(long)(this->Members).
                                     super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)local_98);
    }
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_start = pMVar8;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar12 + 1;
    (this->Members).
    super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar8 + (long)this_00;
    this->AnyRequired = true;
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
  }
  else {
    pcVar5 = name->_M_str;
    (pMVar3->Name)._M_len = name->_M_len;
    (pMVar3->Name)._M_str = pcVar5;
    (pMVar3->Function)._M_invoker =
         std::
         _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
         ::_M_invoke;
    *(undefined8 **)&(pMVar3->Function).super__Function_base._M_functor = local_b8;
    *(undefined8 *)((long)&(pMVar3->Function).super__Function_base._M_functor + 8) = uStack_b0;
    (pMVar3->Function).super__Function_base._M_manager =
         std::
         _Function_handler<cmCTestResourceSpec::ReadFileResult_((anonymous_namespace)::Version_&,_const_Json::Value_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmJSONHelpers.h:40:32)>
         ::_M_manager;
    pMVar3->Required = true;
    ppMVar1 = &(this->Members).
               super__Vector_base<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member,_std::allocator<cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Object<(anonymous_namespace)::Version>::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
    this->AnyRequired = true;
  }
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  return this;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }